

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O0

void __thiscall iDynTree::ExternalMesh::~ExternalMesh(ExternalMesh *this)

{
  SolidShape *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  in_RDI->_vptr_SolidShape = (_func_int **)&PTR__ExternalMesh_004fa620;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  SolidShape::~SolidShape(in_RDI);
  return;
}

Assistant:

ExternalMesh::~ExternalMesh()
    {
    }